

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_iterator.c
# Opt level: O1

mpt_metatype * mpt_message_iterator(mpt_message *ptr,int asep)

{
  int iVar1;
  mpt_metatype *pmVar2;
  mpt_array a;
  mpt_array local_18;
  
  local_18._buf = (mpt_buffer *)0x0;
  if ((ptr != (mpt_message *)0x0) && (iVar1 = mpt_array_message(&local_18,ptr,asep), iVar1 < 0)) {
    return (mpt_metatype *)0x0;
  }
  pmVar2 = mpt_meta_buffer(&local_18);
  mpt_array_clone(&local_18,(mpt_array *)0x0);
  return pmVar2;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_message_iterator(const MPT_STRUCT(message) *ptr, int asep)
{
	MPT_STRUCT(array) a = MPT_ARRAY_INIT;
	MPT_INTERFACE(metatype) *mt;
	int len;
	
	if (ptr && (len = mpt_array_message(&a, ptr, asep)) < 0) {
		return 0;
	}
	mt = mpt_meta_buffer(&a);
	mpt_array_clone(&a, 0);
	return mt;
}